

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_mem_manager.cpp
# Opt level: O0

bool __thiscall SharedMemoryManager::AttachShMem(SharedMemoryManager *this)

{
  void *pvVar1;
  long in_RDI;
  bool bVar2;
  
  pvVar1 = shmat(*(int *)(in_RDI + 4),(void *)0x0,0);
  *(void **)(in_RDI + 0x10) = pvVar1;
  bVar2 = *(long *)(in_RDI + 0x10) != -1;
  if (bVar2) {
    *(int *)(in_RDI + 0x18) = *(int *)(in_RDI + 0x18) + 1;
  }
  return bVar2;
}

Assistant:

bool SharedMemoryManager::AttachShMem()
{            
	sh_mem_start_addr_ = shmat(sh_mem_id_ , NULL, 0);

	if (sh_mem_start_addr_ == (void *) -1) {
        DEBUG_ELOG("shmat error: "<< strerror(errno) <<",sh_mem_id_="<<sh_mem_id_);
		return false;
	}
    total_attached_ ++ ;
    return true;
}